

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcicc.c
# Opt level: O0

void jpeg_write_icc_profile(j_compress_ptr cinfo,JOCTET *icc_data_ptr,uint icc_data_len)

{
  uint uVar1;
  uint in_EDX;
  long in_RSI;
  long *in_RDI;
  uint length;
  int cur_marker;
  uint num_markers;
  uint in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  uint uVar2;
  int iVar3;
  uint local_14;
  
  iVar3 = 1;
  if ((in_RSI == 0) || (in_EDX == 0)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x17;
    (**(code **)*in_RDI)(in_RDI);
  }
  local_14 = in_EDX;
  if (*(int *)((long)in_RDI + 0x24) < 0x65) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x14;
    *(undefined4 *)(*in_RDI + 0x2c) = *(undefined4 *)((long)in_RDI + 0x24);
    (**(code **)*in_RDI)(in_RDI);
  }
  while (local_14 != 0) {
    uVar2 = local_14;
    if (0xffef < local_14) {
      uVar2 = 0xffef;
    }
    local_14 = local_14 - uVar2;
    jpeg_write_m_header((j_compress_ptr)CONCAT44(iVar3,uVar2),in_stack_ffffffffffffffdc,
                        in_stack_ffffffffffffffd8);
    jpeg_write_m_byte((j_compress_ptr)CONCAT44(iVar3,uVar2),in_stack_ffffffffffffffdc);
    jpeg_write_m_byte((j_compress_ptr)CONCAT44(iVar3,uVar2),in_stack_ffffffffffffffdc);
    jpeg_write_m_byte((j_compress_ptr)CONCAT44(iVar3,uVar2),in_stack_ffffffffffffffdc);
    jpeg_write_m_byte((j_compress_ptr)CONCAT44(iVar3,uVar2),in_stack_ffffffffffffffdc);
    jpeg_write_m_byte((j_compress_ptr)CONCAT44(iVar3,uVar2),in_stack_ffffffffffffffdc);
    jpeg_write_m_byte((j_compress_ptr)CONCAT44(iVar3,uVar2),in_stack_ffffffffffffffdc);
    jpeg_write_m_byte((j_compress_ptr)CONCAT44(iVar3,uVar2),in_stack_ffffffffffffffdc);
    jpeg_write_m_byte((j_compress_ptr)CONCAT44(iVar3,uVar2),in_stack_ffffffffffffffdc);
    jpeg_write_m_byte((j_compress_ptr)CONCAT44(iVar3,uVar2),in_stack_ffffffffffffffdc);
    jpeg_write_m_byte((j_compress_ptr)CONCAT44(iVar3,uVar2),in_stack_ffffffffffffffdc);
    jpeg_write_m_byte((j_compress_ptr)CONCAT44(iVar3,uVar2),in_stack_ffffffffffffffdc);
    jpeg_write_m_byte((j_compress_ptr)CONCAT44(iVar3,uVar2),in_stack_ffffffffffffffdc);
    jpeg_write_m_byte((j_compress_ptr)CONCAT44(iVar3,uVar2),in_stack_ffffffffffffffdc);
    jpeg_write_m_byte((j_compress_ptr)CONCAT44(iVar3,uVar2),in_stack_ffffffffffffffdc);
    while (uVar1 = uVar2 - 1, uVar2 != 0) {
      jpeg_write_m_byte((j_compress_ptr)CONCAT44(iVar3,uVar1),in_stack_ffffffffffffffdc);
      uVar2 = uVar1;
    }
    iVar3 = iVar3 + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_write_icc_profile(j_compress_ptr cinfo, const JOCTET *icc_data_ptr,
                       unsigned int icc_data_len)
{
  unsigned int num_markers;     /* total number of markers we'll write */
  int cur_marker = 1;           /* per spec, counting starts at 1 */
  unsigned int length;          /* number of bytes to write in this marker */

  if (icc_data_ptr == NULL || icc_data_len == 0)
    ERREXIT(cinfo, JERR_BUFFER_SIZE);
  if (cinfo->global_state < CSTATE_SCANNING)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  /* Calculate the number of markers we'll need, rounding up of course */
  num_markers = icc_data_len / MAX_DATA_BYTES_IN_MARKER;
  if (num_markers * MAX_DATA_BYTES_IN_MARKER != icc_data_len)
    num_markers++;

  while (icc_data_len > 0) {
    /* length of profile to put in this marker */
    length = icc_data_len;
    if (length > MAX_DATA_BYTES_IN_MARKER)
      length = MAX_DATA_BYTES_IN_MARKER;
    icc_data_len -= length;

    /* Write the JPEG marker header (APP2 code and marker length) */
    jpeg_write_m_header(cinfo, ICC_MARKER,
                        (unsigned int)(length + ICC_OVERHEAD_LEN));

    /* Write the marker identifying string "ICC_PROFILE" (null-terminated).  We
     * code it in this less-than-transparent way so that the code works even if
     * the local character set is not ASCII.
     */
    jpeg_write_m_byte(cinfo, 0x49);
    jpeg_write_m_byte(cinfo, 0x43);
    jpeg_write_m_byte(cinfo, 0x43);
    jpeg_write_m_byte(cinfo, 0x5F);
    jpeg_write_m_byte(cinfo, 0x50);
    jpeg_write_m_byte(cinfo, 0x52);
    jpeg_write_m_byte(cinfo, 0x4F);
    jpeg_write_m_byte(cinfo, 0x46);
    jpeg_write_m_byte(cinfo, 0x49);
    jpeg_write_m_byte(cinfo, 0x4C);
    jpeg_write_m_byte(cinfo, 0x45);
    jpeg_write_m_byte(cinfo, 0x0);

    /* Add the sequencing info */
    jpeg_write_m_byte(cinfo, cur_marker);
    jpeg_write_m_byte(cinfo, (int)num_markers);

    /* Add the profile data */
    while (length--) {
      jpeg_write_m_byte(cinfo, *icc_data_ptr);
      icc_data_ptr++;
    }
    cur_marker++;
  }
}